

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

ON_wString __thiscall ON_XMLVariant::TypeAsString(ON_XMLVariant *this)

{
  uint uVar1;
  long in_RSI;
  wchar_t *s;
  
  uVar1 = *(int *)(*(long *)(in_RSI + 8) + 0xa4) - 1;
  if (uVar1 < 0xd) {
    s = (wchar_t *)(&DAT_006f9e6c + *(int *)(&DAT_006f9e6c + (ulong)uVar1 * 4));
  }
  else {
    s = L"null";
  }
  ON_wString::ON_wString((ON_wString *)this,s);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_XMLVariant::TypeAsString(void) const
{
  switch (_private->_type)
  {
  case Types::Bool:         return L"bool";
  case Types::Integer:      return L"integer";
  case Types::Float:        return L"float";
  case Types::Double:       return L"double";
  case Types::DoubleArray2: return L"2-double-array";
  case Types::DoubleArray3: return L"3-double-array";
  case Types::DoubleArray4: return L"4-double-array";
  case Types::DoubleColor4: return L"color";
  case Types::Matrix:       return L"matrix-4x4";
  case Types::Uuid:         return L"uuid";
  case Types::String:       return L"string";
  case Types::Time:         return L"time";
  case Types::Buffer:       return L"buffer";
  case Types::Null:
  default:
    return L"null";
  }
}